

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.h
# Opt level: O2

int __thiscall crnlib::dxt_image::pack_params::init(pack_params *this,EVP_PKEY_CTX *ctx)

{
  crn_dxt_compressor_type cVar1;
  
  this->m_perceptual = (bool)((byte)ctx[0x20] & 1);
  this->m_num_helper_threads = *(uint *)(ctx + 0x358);
  this->m_use_both_block_types = (bool)((byte)ctx[0x20] >> 3 & 1);
  this->m_use_transparent_indices_for_black = (bool)((byte)ctx[0x20] >> 4 & 1);
  this->m_dxt1a_alpha_threshold = *(uint *)(ctx + 0x330);
  this->m_quality = *(crn_dxt_quality *)(ctx + 0x334);
  this->m_endpoint_caching = ((byte)ctx[0x20] & 0x20) == 0;
  this->m_grayscale_sampling = (bool)((byte)ctx[0x21] & 1);
  cVar1 = *(crn_dxt_compressor_type *)(ctx + 0x338);
  this->m_compressor = cVar1;
  return cVar1;
}

Assistant:

void init(const crn_comp_params& params) {
      m_perceptual = (params.m_flags & cCRNCompFlagPerceptual) != 0;
      m_num_helper_threads = params.m_num_helper_threads;
      m_use_both_block_types = (params.m_flags & cCRNCompFlagUseBothBlockTypes) != 0;
      m_use_transparent_indices_for_black = (params.m_flags & cCRNCompFlagUseTransparentIndicesForBlack) != 0;
      m_dxt1a_alpha_threshold = params.m_dxt1a_alpha_threshold;
      m_quality = params.m_dxt_quality;
      m_endpoint_caching = (params.m_flags & cCRNCompFlagDisableEndpointCaching) == 0;
      m_grayscale_sampling = (params.m_flags & cCRNCompFlagGrayscaleSampling) != 0;
      m_compressor = params.m_dxt_compressor_type;
    }